

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O2

int __thiscall
CVmGramProdState::clone
          (CVmGramProdState *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int iVar1;
  undefined4 extraout_var;
  CVmGramProdState *pCVar2;
  
  if (this->enclosing_ == (CVmGramProdState *)0x0) {
    pCVar2 = (CVmGramProdState *)0x0;
  }
  else {
    iVar1 = clone(this->enclosing_,__fn,__child_stack,__flags,__arg);
    pCVar2 = (CVmGramProdState *)CONCAT44(extraout_var,iVar1);
  }
  pCVar2 = alloc((CVmGramProdMem *)__fn,(int)this->tok_pos_,(int)this->alt_pos_,pCVar2,this->altp_,
                 this->prod_obj_,this->circular_alt_);
  pCVar2->sub_target_prop_ = this->sub_target_prop_;
  if (this->alt_pos_ != 0) {
    memcpy(pCVar2->match_list_,this->match_list_,this->alt_pos_ << 3);
  }
  pCVar2->nxt_ = (CVmGramProdState *)0x0;
  pCVar2->matched_star_ = this->matched_star_;
  return (int)pCVar2;
}

Assistant:

CVmGramProdState *clone(CVmGramProdMem *mem)
    {
        CVmGramProdState *new_state;
        CVmGramProdState *new_enclosing;

        /* clone our enclosing state */
        new_enclosing = (enclosing_ != 0 ? enclosing_->clone(mem) : 0);
        
        /* create a new state object */
        new_state = alloc(mem, tok_pos_, alt_pos_, new_enclosing,
                          altp_, prod_obj_, circular_alt_);

        /* copy the target sub-production property */
        new_state->sub_target_prop_ = sub_target_prop_;

        /* copy the valid portion of my match list */
        if (alt_pos_ != 0)
            memcpy(new_state->match_list_, match_list_,
                   alt_pos_ * sizeof(match_list_[0]));

        /* we're not yet in any queue */
        new_state->nxt_ = 0;

        /* set the '*' flag in the cloned state */
        new_state->matched_star_ = matched_star_;

        /* return the clone */
        return new_state;
    }